

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

void __thiscall
ON_Write3dmBufferArchive::ON_Write3dmBufferArchive
          (ON_Write3dmBufferArchive *this,size_t initial_sizeof_buffer,size_t max_sizeof_buffer,
          int archive_3dm_version,uint archive_opennurbs_version)

{
  ON_BinaryArchive::ON_BinaryArchive(&this->super_ON_BinaryArchive,write3dm);
  (this->super_ON_BinaryArchive)._vptr_ON_BinaryArchive =
       (_func_int **)&PTR__ON_Write3dmBufferArchive_0081ce68;
  this->m_p = (void *)0x0;
  this->m_buffer = (uchar *)0x0;
  this->m_sizeof_buffer = 0;
  this->m_max_sizeof_buffer = max_sizeof_buffer;
  this->m_sizeof_archive = 0;
  this->m_buffer_position = 0;
  this->m_reserved1 = 0;
  this->m_reserved2 = 0;
  this->m_reserved3 = 0;
  this->m_reserved4 = 0;
  if (initial_sizeof_buffer != 0) {
    AllocBuffer(this,initial_sizeof_buffer);
  }
  if (archive_3dm_version < 2) {
    archive_3dm_version = ON_BinaryArchive::CurrentArchiveVersion();
    archive_opennurbs_version = ON::Version();
  }
  ON_BinaryArchive::SetArchive3dmVersion(&this->super_ON_BinaryArchive,archive_3dm_version);
  ON_SetBinaryArchiveOpenNURBSVersion(&this->super_ON_BinaryArchive,archive_opennurbs_version);
  return;
}

Assistant:

ON_Write3dmBufferArchive::ON_Write3dmBufferArchive( 
          size_t initial_sizeof_buffer, 
          size_t max_sizeof_buffer, 
          int archive_3dm_version,
          unsigned int archive_opennurbs_version
          )
: ON_BinaryArchive(ON::archive_mode::write3dm)
, m_p(0)
, m_buffer(0)
, m_sizeof_buffer(0)
, m_max_sizeof_buffer(max_sizeof_buffer)
, m_sizeof_archive(0)
, m_buffer_position(0)
, m_reserved1(0)
, m_reserved2(0)
, m_reserved3(0)
, m_reserved4(0)
{
  if ( initial_sizeof_buffer > 0 )
    AllocBuffer(initial_sizeof_buffer);
  if ( archive_3dm_version < 2 )
  {
    archive_3dm_version = ON_BinaryArchive::CurrentArchiveVersion();
    archive_opennurbs_version = ON::Version();
  }
  SetArchive3dmVersion(archive_3dm_version);
  ON_SetBinaryArchiveOpenNURBSVersion(*this,archive_opennurbs_version);
}